

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mpi_select(mbedtls_mpi *R,mbedtls_mpi *T,size_t T_size,size_t idx)

{
  int iVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  
  iVar1 = -0x6e;
  uVar3 = 0;
  do {
    if (T_size == uVar3) {
      return iVar1;
    }
    iVar2 = mbedtls_mpi_safe_cond_assign
                      (R,T,~((char)((byte)(-(idx ^ uVar3) >> 0x38) | (byte)((idx ^ uVar3) >> 0x38))
                            >> 7));
    uVar3 = uVar3 + 1;
    T = T + 1;
    iVar1 = 0;
  } while (iVar2 == 0);
  return iVar2;
}

Assistant:

static int mpi_select(mbedtls_mpi *R, const mbedtls_mpi *T, size_t T_size, size_t idx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    for (size_t i = 0; i < T_size; i++) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_safe_cond_assign(R, &T[i],
                                                     (unsigned char) mbedtls_ct_uint_eq(i, idx)));
    }
cleanup:
    return ret;
}